

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O2

shared_ptr<duckdb::MultiFileList,_true> __thiscall
duckdb::MultiFileReader::CreateFileList
          (MultiFileReader *this,ClientContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *paths,FileGlobOptions options)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  int iVar2;
  pointer pGVar3;
  IOException *this_00;
  undefined7 in_register_00000009;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  FileGlobOptions in_R8B;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  shared_ptr<duckdb::MultiFileList,_true> sVar4;
  FileGlobOptions options_local;
  allocator local_91;
  _Head_base<0UL,_duckdb::GlobMultiFileList_*,_false> local_90;
  vector<duckdb::OpenFileInfo,_true> open_files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  open_files.super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  open_files.super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  open_files.super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((undefined8 *)CONCAT71(in_register_00000009,options))[1];
  options_local = in_R8B;
  for (__args = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                 CONCAT71(in_register_00000009,options); __args != pbVar1; __args = __args + 1) {
    ::std::vector<duckdb::OpenFileInfo,std::allocator<duckdb::OpenFileInfo>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<duckdb::OpenFileInfo,std::allocator<duckdb::OpenFileInfo>> *)&open_files,
               __args);
  }
  make_uniq<duckdb::GlobMultiFileList,duckdb::ClientContext&,duckdb::vector<duckdb::OpenFileInfo,true>,duckdb::FileGlobOptions&>
            ((duckdb *)&local_90,(ClientContext *)paths,&open_files,&options_local);
  pGVar3 = unique_ptr<duckdb::GlobMultiFileList,_std::default_delete<duckdb::GlobMultiFileList>,_true>
           ::operator->((unique_ptr<duckdb::GlobMultiFileList,_std::default_delete<duckdb::GlobMultiFileList>,_true>
                         *)&local_90);
  iVar2 = (*(pGVar3->super_MultiFileList)._vptr_MultiFileList[5])(pGVar3);
  if ((char)iVar2 != '\0' || options_local != DISALLOW_EMPTY) {
    ::std::__shared_ptr<duckdb::MultiFileList,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<duckdb::GlobMultiFileList,std::default_delete<duckdb::GlobMultiFileList>,void>
              ((__shared_ptr<duckdb::MultiFileList,(__gnu_cxx::_Lock_policy)2> *)this,
               (unique_ptr<duckdb::GlobMultiFileList,_std::default_delete<duckdb::GlobMultiFileList>_>
                *)&local_90);
    if (local_90._M_head_impl != (GlobMultiFileList *)0x0) {
      (*((local_90._M_head_impl)->super_MultiFileList)._vptr_MultiFileList[1])();
    }
    std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
              (&open_files.super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
              );
    sVar4.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = extraout_RDX._M_pi;
    sVar4.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<duckdb::MultiFileList,_true>)
           sVar4.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_50,"%s needs at least one file to read",&local_91)
  ;
  ::std::__cxx11::string::string
            ((string *)&local_70,
             (string *)
             &(context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  IOException::IOException<std::__cxx11::string>(this_00,&local_50,&local_70);
  __cxa_throw(this_00,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

shared_ptr<MultiFileList> MultiFileReader::CreateFileList(ClientContext &context, const vector<string> &paths,
                                                          FileGlobOptions options) {
	vector<OpenFileInfo> open_files;
	for (auto &path : paths) {
		open_files.emplace_back(path);
	}
	auto res = make_uniq<GlobMultiFileList>(context, std::move(open_files), options);
	if (res->GetExpandResult() == FileExpandResult::NO_FILES && options == FileGlobOptions::DISALLOW_EMPTY) {
		throw IOException("%s needs at least one file to read", function_name);
	}
	return std::move(res);
}